

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryStats.cpp
# Opt level: O0

DictionaryStats * __thiscall DictionaryStats::Clone(DictionaryStats *this)

{
  NoCheckHeapAllocator *alloc;
  DictionaryStats *this_00;
  TrackAllocData local_40;
  DictionaryStats *cloned;
  DictionaryStats *this_local;
  
  cloned = this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryStats.cpp"
             ,0x17);
  alloc = Memory::NoCheckHeapAllocator::TrackAllocInfo
                    ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,&local_40);
  this_00 = (DictionaryStats *)new<Memory::NoCheckHeapAllocator>(0x38,alloc,0x3d5f00);
  DictionaryStats(this_00,this->pName,this->initialSize);
  this_00->finalSize = this->finalSize;
  this_00->countOfEmptyBuckets = this->countOfEmptyBuckets;
  this_00->countOfResize = this->countOfResize;
  this_00->itemCount = this->itemCount;
  this_00->maxDepth = this->maxDepth;
  this_00->lookupCount = this->lookupCount;
  this_00->collisionCount = this->collisionCount;
  this_00->lookupDepthTotal = this->lookupDepthTotal;
  this_00->maxLookupDepth = this->maxLookupDepth;
  this_00->pName = this->pName;
  return this_00;
}

Assistant:

DictionaryStats* DictionaryStats::Clone()
{
    DictionaryStats* cloned = NoCheckHeapNew(DictionaryStats, pName, initialSize);
    cloned->finalSize = finalSize;
    cloned->countOfEmptyBuckets = countOfEmptyBuckets;
    cloned->countOfResize = countOfResize;
    cloned->itemCount = itemCount;
    cloned->maxDepth = maxDepth;
    cloned->lookupCount = lookupCount;
    cloned->collisionCount = collisionCount;
    cloned->lookupDepthTotal = lookupDepthTotal;
    cloned->maxLookupDepth = maxLookupDepth;
    cloned->pName = pName;
    return cloned;
}